

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
ReconnectIRCCommand::trigger
          (ReconnectIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type sVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  __sv_type _Var12;
  size_t local_138;
  char *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  __sv_type local_f8;
  size_t local_e8;
  char *pcStack_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined8 local_98;
  Server *server;
  uint local_7c;
  undefined1 local_78 [4];
  uint i;
  string msg;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  ReconnectIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar10 = channel._M_str;
  sVar11 = channel._M_len;
  lVar4 = Jupiter::IRC::Client::getChannel(source,sVar11,pcVar10);
  if (lVar4 != 0) {
    msg.field_2._12_4_ = Jupiter::IRC::Client::Channel::getType();
    std::__cxx11::string::string((string *)local_78);
    local_7c = 0;
    while( true ) {
      uVar6 = (ulong)local_7c;
      RenX::getCore();
      uVar5 = RenX::Core::getServerCount();
      if (uVar6 == uVar5) break;
      uVar6 = RenX::getCore();
      local_98 = RenX::Core::getServer(uVar6);
      bVar1 = RenX::Server::isLogChanType((int)local_98);
      if ((bVar1 & 1) != 0) {
        bVar1 = RenX::Server::reconnect((DisconnectReason)local_98);
        if ((bVar1 & 1) == 0) {
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   RenX::Server::getHostname_abi_cxx11_();
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(pbVar7);
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   RenX::Server::getHostname_abi_cxx11_();
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(pbVar7);
          uVar3 = RenX::Server::getPort();
          string_printf_abi_cxx11_
                    (&local_d8,"[RenX] ERROR: Failed to connect to %.*s on port %u.\r\n",sVar8,
                     pcVar9,(ulong)uVar3);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        else {
          s_abi_cxx11_(&local_b8,"Connection established",0x16);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        local_e8 = sVar11;
        pcStack_e0 = pcVar10;
        local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
        Jupiter::IRC::Client::sendMessage
                  (source,local_e8,pcStack_e0,local_f8._M_len,local_f8._M_str);
      }
      local_7c = local_7c + 1;
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
    if (bVar2) {
      s_abi_cxx11_(&local_118,"ERROR: No servers found to connect to.",0x26);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_118);
      std::__cxx11::string::~string((string *)&local_118);
      _Var12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
      local_138 = _Var12._M_len;
      local_130 = _Var12._M_str;
      Jupiter::IRC::Client::sendMessage(source,sVar11,pcVar10,local_138,local_130);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void ReconnectIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view ) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		std::string msg;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type)) {
				if (server->reconnect(RenX::DisconnectReason::Triggered)) {
					msg = "Connection established"s;
				}
				else {
					msg = string_printf("[RenX] ERROR: Failed to connect to %.*s on port %u." ENDL, server->getHostname().size(), server->getHostname().c_str(), server->getPort());
				}
				source->sendMessage(channel, msg);
			}
		}
		if (msg.empty()) {
			// We didn't connect anywhere!!
			msg = "ERROR: No servers found to connect to."s;
			source->sendMessage(channel, msg);
		}
	}
}